

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ba9::DataDump<sptk::int24_t>::Run
          (DataDump<sptk::int24_t> *this,istream *input_stream)

{
  bool bVar1;
  string *in_RDI;
  int index;
  int24_t data;
  char buffer [128];
  ostream *in_stack_ffffffffffffff20;
  ostream *in_stack_ffffffffffffff28;
  ostream *in_stack_ffffffffffffff30;
  undefined5 in_stack_ffffffffffffff38;
  byte in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int24_t local_b0 [5];
  int local_a0;
  int24_t local_9b;
  char local_98 [151];
  byte local_1;
  
  sptk::int24_t::int24_t((int24_t *)0x106b7e);
  local_a0 = *(int *)(in_RDI + 0x28);
  do {
    bVar1 = sptk::ReadStream<sptk::int24_t>
                      ((int24_t *)in_stack_ffffffffffffff28,(istream *)in_stack_ffffffffffffff20);
    if (!bVar1) {
      local_1 = 1;
LAB_00106ce5:
      sptk::int24_t::~int24_t(&local_9b);
      return (bool)(local_1 & 1);
    }
    local_b0[0].value[2] = local_9b.value[2];
    local_b0[0].value[0] = local_9b.value[0];
    local_b0[0].value[1] = local_9b.value[1];
    in_stack_ffffffffffffff3e =
         sptk::SnPrintf<sptk::int24_t>
                   ((int24_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),in_RDI,
                    CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffff3e,
                                            CONCAT15(in_stack_ffffffffffffff3d,
                                                     in_stack_ffffffffffffff38))),
                    (char *)in_stack_ffffffffffffff30);
    in_stack_ffffffffffffff3d = in_stack_ffffffffffffff3e ^ 0xff;
    sptk::int24_t::~int24_t(local_b0);
    if ((in_stack_ffffffffffffff3d & 1) != 0) {
      local_1 = 0;
      goto LAB_00106ce5;
    }
    in_stack_ffffffffffffff30 = (ostream *)std::ostream::operator<<(&std::cout,local_a0);
    in_stack_ffffffffffffff28 = std::operator<<(in_stack_ffffffffffffff30,'\t');
    in_stack_ffffffffffffff20 = std::operator<<(in_stack_ffffffffffffff28,local_98);
    std::operator<<(in_stack_ffffffffffffff20,'\n');
    if ((*(int *)(in_RDI + 0x2c) != -1) && (*(int *)(in_RDI + 0x2c) == local_a0)) {
      local_a0 = *(int *)(in_RDI + 0x28) + -1;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    T data;
    for (int index(minimum_index_); sptk::ReadStream(&data, input_stream);
         ++index) {
      // Format data.
      if (!sptk::SnPrintf(data, print_format_, sizeof(buffer), buffer)) {
        return false;
      }

      // Dump data. Note that std::endl makes the execution speed slow.
      std::cout << index << '\t' << buffer << '\n';

      // Initialize index.
      if (maximum_index_ != kMagicNumberForEndOfFile &&
          maximum_index_ == index) {
        index = minimum_index_ - 1;
      }
    }
    return true;
  }